

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O3

Atom_p __thiscall indigox::Molecule::NewAtom(Molecule *this,Element_p *e)

{
  Atom *this_00;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Atom_p AVar2;
  Element_p local_20;
  
  NewAtom(this);
  this_00 = (Atom *)(this->super_CountableObject<indigox::Molecule>).id_;
  local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Atom::SetElement(this_00,&local_20);
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Atom_p)AVar2.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::NewAtom(Element_p e) {
  Atom_p atm = NewAtom();
  atm->SetElement(e);
  return atm;
}